

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O0

QDebug QtPrivate::printAssociativeContainer<QHash<QWidget*,QList<QGesture*>>>
                 (QDebug *debug,char *which,QHash<QWidget_*,_QList<QGesture_*>_> *c)

{
  bool bVar1;
  QDebug *pQVar2;
  QList<QGesture_*> *in_RCX;
  QHash<QWidget_*,_QList<QGesture_*>_> *in_RDX;
  const_iterator *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebug *unaff_retaddr;
  const_iterator it;
  QDebugStateSaver saver;
  char t;
  Stream *o;
  QDebug local_50;
  QDebug local_48;
  QDebug local_40;
  QDebug in_stack_ffffffffffffffc8;
  undefined1 *local_10;
  QWidget *widget;
  
  widget = *(QWidget **)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  o = in_RDI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,(QDebug *)in_RSI);
  QDebug::nospace((QDebug *)in_RSI);
  QDebug::operator<<((QDebug *)in_RDX,(char *)in_stack_ffffffffffffffc8.stream);
  QDebug::operator<<((QDebug *)in_RDX,(char *)in_stack_ffffffffffffffc8.stream);
  QHash<QWidget_*,_QList<QGesture_*>_>::constBegin(in_RDX);
  while( true ) {
    QHash<QWidget_*,_QList<QGesture_*>_>::constEnd((QHash<QWidget_*,_QList<QGesture_*>_> *)in_RSI);
    bVar1 = QHash<QWidget_*,_QList<QGesture_*>_>::const_iterator::operator!=
                      (in_RSI,(const_iterator *)o);
    t = (char)((ulong)in_RDI >> 0x38);
    if (!bVar1) break;
    pQVar2 = QDebug::operator<<((QDebug *)o,t);
    QDebug::QDebug(&local_50,pQVar2);
    QHash<QWidget_*,_QList<QGesture_*>_>::const_iterator::key((const_iterator *)0x32f73b);
    ::operator<<(unaff_retaddr,widget);
    pQVar2 = QDebug::operator<<((QDebug *)in_RDX,(char *)in_stack_ffffffffffffffc8.stream);
    QDebug::QDebug(&local_40,pQVar2);
    QHash<QWidget_*,_QList<QGesture_*>_>::const_iterator::value((const_iterator *)0x32f775);
    ::operator<<((QDebug *)in_RDX,in_RCX);
    QDebug::operator<<((QDebug *)o,(char)((ulong)in_RDI >> 0x38));
    QDebug::~QDebug((QDebug *)&stack0xffffffffffffffc8);
    QDebug::~QDebug(&local_40);
    QDebug::~QDebug(&local_48);
    QDebug::~QDebug(&local_50);
    QHash<QWidget_*,_QList<QGesture_*>_>::const_iterator::operator++((const_iterator *)in_RCX);
  }
  QDebug::operator<<((QDebug *)o,t);
  QDebug::QDebug((QDebug *)o,(QDebug *)in_RDI);
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(QWidget **)(in_FS_OFFSET + 0x28) == widget) {
    return (QDebug)o;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug printAssociativeContainer(QDebug debug, const char *which, const AssociativeContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << "(";
    for (typename AssociativeContainer::const_iterator it = c.constBegin();
         it != c.constEnd(); ++it) {
        debug << '(' << it.key() << ", " << it.value() << ')';
    }
    debug << ')';
    return debug;
}